

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binproc.c
# Opt level: O0

void nn_binproc_destroy(nn_epbase *self)

{
  nn_fsm *local_20;
  nn_binproc *binproc;
  nn_epbase *self_local;
  
  if (self == (nn_epbase *)0x0) {
    local_20 = (nn_fsm *)0x0;
  }
  else {
    local_20 = (nn_fsm *)(self + -6);
  }
  nn_list_term((nn_list *)&local_20[1].stopped);
  nn_fsm_term(local_20);
  nn_ins_item_term((nn_ins_item *)&local_20[1].shutdown_fn);
  nn_free(local_20);
  return;
}

Assistant:

static void nn_binproc_destroy (struct nn_epbase *self)
{
    struct nn_binproc *binproc;

    binproc = nn_cont (self, struct nn_binproc, item.epbase);

    nn_list_term (&binproc->sinprocs);
    nn_fsm_term (&binproc->fsm);
    nn_ins_item_term (&binproc->item);

    nn_free (binproc);
}